

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer pfVar1;
  bool bVar2;
  id __id;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ostream *poVar4;
  future<void> *iter;
  pointer this;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> *__range1;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> results;
  undefined1 local_5f0 [16];
  string inputFile;
  string symbolName;
  string streamType;
  type func;
  StockMatcher matcher;
  
  if (argc == 4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inputFile,argv[1],(allocator<char> *)&matcher);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&symbolName,argv[2],(allocator<char> *)&matcher);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&streamType,argv[3],(allocator<char> *)&matcher);
    bVar2 = std::operator==(&streamType,"F");
    StockMatcher::StockMatcher(&matcher,&symbolName,&inputFile,(uint)!bVar2);
    results.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    results.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    results.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ThreadPool::enqueue<std::_Bind<void(StockMatcher::*(StockMatcher*))()>&>
              ((ThreadPool *)local_5f0,(_Bind<void_(StockMatcher::*(StockMatcher_*))()> *)&pool);
    std::vector<std::future<void>,std::allocator<std::future<void>>>::
    emplace_back<std::future<void>>
              ((vector<std::future<void>,std::allocator<std::future<void>>> *)&results,
               (future<void> *)local_5f0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5f0 + 8));
    poVar4 = std::operator<<((ostream *)&std::cout,"Main Thread id = ");
    __id._M_thread = pthread_self();
    pbVar3 = std::operator<<(poVar4,__id);
    std::endl<char,std::char_traits<char>>(pbVar3);
    pfVar1 = results.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (this = results.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                _M_impl.super__Vector_impl_data._M_start; this != pfVar1; this = this + 1) {
      std::future<void>::get(this);
    }
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector(&results);
    StockMatcher::~StockMatcher(&matcher);
    std::__cxx11::string::~string((string *)&streamType);
    std::__cxx11::string::~string((string *)&symbolName);
    std::__cxx11::string::~string((string *)&inputFile);
  }
  else {
    if (argc != 2) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "Invalid Usage : Proper usage is OrderMatchingEngine [inputfile] [symbol] [F/C]"
                              );
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "Invalid Usage : Proper usage is OrderMatchingEngine [feedConfigFile]"
                              );
      std::endl<char,std::char_traits<char>>(poVar4);
      exit(1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inputFile,argv[1],(allocator<char> *)&symbolName);
    FeedFileHandler::FeedFileHandler((FeedFileHandler *)&matcher,&inputFile,&pool);
    std::__cxx11::string::~string((string *)&inputFile);
    FeedFileHandler::process((FeedFileHandler *)&matcher);
    FeedFileHandler::~FeedFileHandler((FeedFileHandler *)&matcher);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	if(argc == 2)
	{
		FeedFileHandler handler(argv[1],pool);
		handler.process();
		return(0);
	}

	if(argc != 4 && argc != 2)
	{
		std::cout << "Invalid Usage : Proper usage is OrderMatchingEngine [inputfile] [symbol] [F/C]" << std::endl;
		std::cout << "Invalid Usage : Proper usage is OrderMatchingEngine [feedConfigFile]" << std::endl;
		exit(1);
	}

	std::string inputFile = argv[1];
	std::string symbolName = argv[2];
	std::string streamType = argv[3];
	outputStreamType stream;

	if(streamType == "F")
		stream = outputStreamType::fileStream;
	else
		stream = outputStreamType::consoleStream;

	StockMatcher matcher(symbolName , inputFile, stream);
	auto func = std::bind(&StockMatcher::executeMatching, &matcher);
	std::vector<std::future<void>> results;
	results.emplace_back(pool.enqueue(func));
	std::cout << "Main Thread id = " << std::this_thread::get_id() << std::endl;
	for(auto&& iter : results)
		iter.get();
	return(0);
}